

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall
Lowerer::PinTypeRef(Lowerer *this,JITTypeHolder type,void *typeRef,Instr *instr,
                   PropertyId propertyId)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *pJVar2;
  FunctionJITTimeInfo *pFVar3;
  char16 *pcVar4;
  char16 *pcVar5;
  char16 *pcVar6;
  char16_t *pcVar7;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  
  debugStringBuffer._76_4_ = propertyId;
  Func::PinTypeRef(this->m_func,typeRef);
  pJVar2 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar2);
  pFVar3 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(pFVar3);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015b6718,TracePinnedTypesPhase,sourceContextId,functionId);
  if (bVar1) {
    pJVar2 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    pcVar4 = JITTimeFunctionBody::GetDisplayName(pJVar2);
    pFVar3 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    pcVar5 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar3,(wchar (*) [42])local_88);
    pcVar6 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
    pcVar7 = L"weak";
    if ((Type)typeRef == type.t) {
      pcVar7 = L"strong";
    }
    Output::Print(L"PinnedTypes: function %s(%s) instr %s property ID %u pinned %s reference 0x%p to type 0x%p.\n"
                  ,pcVar4,pcVar5,pcVar6,(ulong)(uint)debugStringBuffer._76_4_,pcVar7,typeRef,type.t)
    ;
    Output::Flush();
  }
  return;
}

Assistant:

void
Lowerer::PinTypeRef(JITTypeHolder type, void* typeRef, IR::Instr* instr, Js::PropertyId propertyId)
{
    this->m_func->PinTypeRef(typeRef);

    if (PHASE_TRACE(Js::TracePinnedTypesPhase, this->m_func))
    {
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(_u("PinnedTypes: function %s(%s) instr %s property ID %u pinned %s reference 0x%p to type 0x%p.\n"),
            this->m_func->GetJITFunctionBody()->GetDisplayName(), this->m_func->GetDebugNumberSet(debugStringBuffer),
            Js::OpCodeUtil::GetOpCodeName(instr->m_opcode), propertyId,
            typeRef == type.t ? _u("strong") : _u("weak"), typeRef, type.t);
        Output::Flush();
    }
}